

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip6.c
# Opt level: O1

Curl_addrinfo * Curl_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data;
  bool bVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *buffer;
  Curl_addrinfo *res;
  addrinfo hints;
  char sbuf [12];
  char addrbuf [128];
  Curl_addrinfo *local_f0;
  addrinfo local_e8;
  char local_b4 [12];
  undefined1 local_a8 [128];
  
  data = conn->data;
  *waitp = 0;
  if (conn->ip_version == 1) {
    bVar1 = true;
    uVar5 = 2;
  }
  else if (conn->ip_version == 2) {
    uVar5 = 10;
    bVar1 = false;
  }
  else {
    bVar1 = false;
    uVar5 = 0;
  }
  uVar3 = 2;
  if (!bVar1) {
    _Var2 = Curl_ipv6works();
    uVar3 = 2;
    if (_Var2) {
      uVar3 = uVar5;
    }
  }
  local_e8.ai_canonname = (char *)0x0;
  local_e8.ai_next = (addrinfo *)0x0;
  local_e8.ai_addrlen = 0;
  local_e8._20_4_ = 0;
  local_e8.ai_addr = (sockaddr *)0x0;
  local_e8._0_8_ = (ulong)uVar3 << 0x20;
  local_e8.ai_protocol = 0;
  local_e8.ai_socktype = conn->socktype;
  iVar4 = inet_pton(2,hostname,local_a8);
  if ((iVar4 == 1) || (iVar4 = inet_pton(10,hostname,local_a8), iVar4 == 1)) {
    local_e8.ai_flags = 4;
  }
  if (port == 0) {
    buffer = (char *)0x0;
  }
  else {
    buffer = local_b4;
    curl_msnprintf(buffer,0xc,"%d",(ulong)(uint)port);
  }
  iVar4 = Curl_getaddrinfo_ex(hostname,buffer,&local_e8,&local_f0);
  if (iVar4 != 0) {
    Curl_infof(data,"getaddrinfo(3) failed for %s:%d\n",hostname,(ulong)(uint)port);
    local_f0 = (Curl_addrinfo *)0x0;
  }
  return local_f0;
}

Assistant:

Curl_addrinfo *Curl_getaddrinfo(struct connectdata *conn,
                                const char *hostname,
                                int port,
                                int *waitp)
{
  struct addrinfo hints;
  Curl_addrinfo *res;
  int error;
  char sbuf[12];
  char *sbufptr = NULL;
#ifndef USE_RESOLVE_ON_IPS
  char addrbuf[128];
#endif
  int pf;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  struct Curl_easy *data = conn->data;
#endif

  *waitp = 0; /* synchronous response only */

  /* Check if a limited name resolve has been requested */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works())
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = conn->socktype;

#ifndef USE_RESOLVE_ON_IPS
  /*
   * The AI_NUMERICHOST must not be set to get synthesized IPv6 address from
   * an IPv4 address on iOS and Mac OS X.
   */
  if((1 == Curl_inet_pton(AF_INET, hostname, addrbuf)) ||
     (1 == Curl_inet_pton(AF_INET6, hostname, addrbuf))) {
    /* the given address is numerical only, prevent a reverse lookup */
    hints.ai_flags = AI_NUMERICHOST;
  }
#endif

  if(port) {
    snprintf(sbuf, sizeof(sbuf), "%d", port);
    sbufptr = sbuf;
  }

  error = Curl_getaddrinfo_ex(hostname, sbufptr, &hints, &res);
  if(error) {
    infof(data, "getaddrinfo(3) failed for %s:%d\n", hostname, port);
    return NULL;
  }

  if(port) {
    Curl_addrinfo_set_port(res, port);
  }

  dump_addrinfo(conn, res);

  return res;
}